

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
density::
conc_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
::start_emplace<std::__cxx11::string,std::__cxx11::string>
          (put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *i_construction_params)

{
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_construction_params_local;
  conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  lock._8_8_ = i_construction_params;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,(mutex_type *)this);
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::start_emplace<std::__cxx11::string,std::__cxx11::string>
            (&local_70,
             (heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)(this + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock._8_8_);
  conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::put_transaction(&local_58,0,(unique_lock<std::mutex> *)local_30,&local_70);
  put_transaction<std::__cxx11::string>::put_transaction<std::__cxx11::string,void>
            ((put_transaction<std::__cxx11::string> *)__return_storage_ptr__,&local_58);
  conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_58);
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::
  put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~put_transaction(&local_70);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }